

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O3

void pztopology::Pr<pztopology::TPZPoint>::Diagnostic(void)

{
  return;
}

Assistant:

void Pr<TFather>::Diagnostic()
	{
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << __PRETTY_FUNCTION__ ;
			sout << " Dimension : " << Dimension << " NCornerNodes " << NCornerNodes << 
			" NSides " << NSides;
			LOGPZ_DEBUG(logger,sout.str());
		}
		
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing smallsides\n";
			TPZStack<int> smallsides;
			int is;
			for(is=0; is<NSides; is++)
			{
				LowerDimensionSides(is,smallsides);
				sout << " side " << is << " allsmallsides " << smallsides << endl;
				int id;
				for(id=0; id < SideDimension(is); id++)
				{
					smallsides.Resize(0);
					LowerDimensionSides(is,smallsides,id);
					sout << " side " << is << " targetdimension " << id << " smallsides " << smallsides << endl;
				}
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static void HigherDimensionSides(int side, TPZStack<int> &high);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing HigherDimensionSides\n";
			int is ;
			for(is=0; is<NSides; is++)
			{
				TPZStack<int> high;
				HigherDimensionSides(is,high);
				sout << "Side " << is << " higherdimensionsides " << high << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		//  static int NSideNodes(int side);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout <<  "Testing NSideNodes\n";
			int is; 
			for(is=0; is<NSides; is++)
			{
				sout << "Side " << is << " NSideNodes " << NSideNodes(is) << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		/**
		 * returns the local node number of the node "node" along side "side"
		 */
		//  static int SideNodeLocId(int side, int node);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing SideNodeLocId\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				int nsnodes = NSideNodes(is);
				int sn;
				sout << "Side " << is << " sidenodelocid ";
				for(sn=0; sn<nsnodes; sn++)
				{
					sout << SideNodeLocId(is,sn) << " ";
				}
				sout << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		//  static void CenterPoint(int side, TPZVec<REAL> &center);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing CenterPoint\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				TPZManVector<REAL> center(Dimension);
				CenterPoint(is,center);
				sout << "Side " << is << center << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		//  static REAL RefElVolume(){return 2.0*TFather::RefElVolume();}
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing RefelVolume\n";
			sout << "Volume " << RefElVolume() << endl;
			LOGPZ_DEBUG(logger,sout.str());
		}
		//  static int SideDimension(int side);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing SideDimension\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				sout << "Side " << is << " sidedimension " << SideDimension(is) << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static TPZTransform<> SideToSideTransform(int sidefrom, int sideto);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing SideToSideTransform\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				TPZStack<int> lower;
				LowerDimensionSides(is,lower);
				int nl = lower.NElements();
				int il;
				for(il=0; il<nl; il++)
				{
					TPZTransform<> tr;
					tr = SideToSideTransform(is,lower[il]);
					sout << "Transform from " << is << " to side " << lower[il] << " " << tr; 
				}
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		//  static TPZTransform<> TransformElementToSide(int side);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing TransformElementToSide\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				TPZTransform<> tr = TransformElementToSide(is);
				sout << "side " << is << " transform " << tr;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		//  static TPZTransform<> TransformSideToElement(int side);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing TransformSideToElement\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				sout << "side " << is << " transform " << TransformSideToElement(is);
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static TPZIntPoints *CreateSideIntegrationRule(int side, int order);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing CreateSideIntegrationRule order 3\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				TPZIntPoints *integ = CreateSideIntegrationRule(is,3);
				sout << "side " << is << endl;
				integ->Print(sout);
				delete integ;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static std::string StrType() ;//{ return EOned;}
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing StrType\n";
			sout << StrType();
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static std::string StrType(int side);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing StrType(side)\n";
			int is; 
			for(is=0; is<NSides; is++)
			{
				sout << "side " << is << " type " << StrType(is) << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static void MapToSide(int side, TPZVec<REAL> &InternalPar, TPZVec<REAL> &SidePar, TPZFMatrix<REAL> &JacToSide);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			TPZManVector<REAL> par(Dimension,sqrt(2.));
			sout << "Testing MapToSide internalpar = " << par <<  "\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				TPZManVector<REAL> sidepar(SideDimension(is));
				TPZFMatrix<REAL> jactoside (SideDimension(is),Dimension);
				MapToSide(is,par,sidepar,jactoside);
				sout << "side " << is << " sidepar " << sidepar << " jactoside " << jactoside << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static int NSides;
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing NumSides\n";
			sout << "nsides " << NumSides();
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		//  static int NContainedSides(int side);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing NContainedSides(side)\n";
			int is;
			for(is=0; is<NSides; is++)
			{
				sout << "side " << is << " nsideconnects " << NContainedSides(is) << endl;
			}
			LOGPZ_DEBUG(logger,sout.str());
		}
		//  static int ContainedSideLocId(int side, int c);
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Testing ContainedSideLocId(is,ic)\n";
			int is,ic;
			for(is=0; is<NSides; is++)
			{
				int nc = NContainedSides(is);
				sout << "side " << is << " connects ";
				for(ic=0; ic<nc; ic++)
				{
					sout << ContainedSideLocId(is,ic) << " ";
				}
				sout << endl;
			}
			
			LOGPZ_DEBUG(logger,sout.str());
		}
		
		
#endif
	}